

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::passLinearObjectives
          (Highs *this,HighsInt num_linear_objective,HighsLinearObjective *linear_objective)

{
  HighsStatus HVar1;
  int in_ESI;
  HighsLinearObjective *in_RDI;
  HighsInt iObj;
  HighsInt in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  if (-1 < in_ESI) {
    std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::clear
              ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)0x4868fe);
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      HVar1 = addLinearObjective((Highs *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_RDI,
                                 in_stack_ffffffffffffffcc);
      if (HVar1 != kOk) {
        return kError;
      }
    }
  }
  return kOk;
}

Assistant:

HighsStatus Highs::passLinearObjectives(
    const HighsInt num_linear_objective,
    const HighsLinearObjective* linear_objective) {
  if (num_linear_objective < 0) return HighsStatus::kOk;
  this->multi_linear_objective_.clear();
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    if (this->addLinearObjective(linear_objective[iObj], iObj) !=
        HighsStatus::kOk)
      return HighsStatus::kError;
  return HighsStatus::kOk;
}